

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableSortSpecsBuild(ImGuiTable *table)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  ImGuiTableColumn *pIVar4;
  ImGuiTableColumnSortSpecs *__dest;
  ImGuiTableColumnSortSpecs *pIVar5;
  long lVar6;
  char cVar7;
  short sVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  
  bVar1 = table->IsSortSpecsDirty;
  if (bVar1 == true) {
    TableSortSpecsSanitize(table);
    iVar3 = (table->SortSpecsMulti).Capacity;
    uVar2 = table->SortSpecsCount;
    cVar7 = '\0';
    if ('\x01' < (char)uVar2) {
      cVar7 = uVar2;
    }
    iVar12 = (int)cVar7;
    if (iVar3 < iVar12) {
      if (iVar3 == 0) {
        iVar11 = 8;
      }
      else {
        iVar11 = iVar3 / 2 + iVar3;
      }
      if (iVar11 <= iVar12) {
        iVar11 = iVar12;
      }
      if (iVar3 < iVar11) {
        __dest = (ImGuiTableColumnSortSpecs *)MemAlloc((long)iVar11 * 0xc);
        pIVar5 = (table->SortSpecsMulti).Data;
        if (pIVar5 != (ImGuiTableColumnSortSpecs *)0x0) {
          memcpy(__dest,pIVar5,(long)(table->SortSpecsMulti).Size * 0xc);
          MemFree((table->SortSpecsMulti).Data);
        }
        (table->SortSpecsMulti).Data = __dest;
        (table->SortSpecsMulti).Capacity = iVar11;
      }
    }
    (table->SortSpecsMulti).Size = iVar12;
    (table->SortSpecs).SpecsDirty = true;
    table->IsSortSpecsDirty = false;
  }
  if (table->SortSpecsCount == '\0') {
    pIVar5 = (ImGuiTableColumnSortSpecs *)0x0;
  }
  else if (table->SortSpecsCount == '\x01') {
    pIVar5 = &table->SortSpecsSingle;
  }
  else {
    pIVar5 = (table->SortSpecsMulti).Data;
  }
  if (((bVar1 & pIVar5 != (ImGuiTableColumnSortSpecs *)0x0) == 1) && (0 < table->ColumnsCount)) {
    lVar6 = 0x65;
    sVar8 = 0;
    lVar9 = 0;
    do {
      pIVar4 = (table->Columns).Data;
      cVar7 = *(char *)((long)pIVar4 + lVar6 + -0xf);
      lVar10 = (long)cVar7;
      if (lVar10 != -1) {
        pIVar5[lVar10].ColumnUserID = *(ImGuiID *)((long)pIVar4 + lVar6 + -0x35);
        pIVar5[lVar10].ColumnIndex = (short)(char)((ushort)sVar8 >> 8);
        pIVar5[lVar10].SortOrder = (short)cVar7;
        pIVar5[lVar10].field_0x8 = *(byte *)((long)&pIVar4->Flags + lVar6) & 3;
      }
      lVar9 = lVar9 + 1;
      sVar8 = sVar8 + 0x100;
      lVar6 = lVar6 + 0x68;
    } while (lVar9 < table->ColumnsCount);
  }
  (table->SortSpecs).Specs = pIVar5;
  (table->SortSpecs).SpecsCount = (int)table->SortSpecsCount;
  return;
}

Assistant:

void ImGui::TableSortSpecsBuild(ImGuiTable* table)
{
    bool dirty = table->IsSortSpecsDirty;
    if (dirty)
    {
        TableSortSpecsSanitize(table);
        table->SortSpecsMulti.resize(table->SortSpecsCount <= 1 ? 0 : table->SortSpecsCount);
        table->SortSpecs.SpecsDirty = true; // Mark as dirty for user
        table->IsSortSpecsDirty = false; // Mark as not dirty for us
    }

    // Write output
    ImGuiTableColumnSortSpecs* sort_specs = (table->SortSpecsCount == 0) ? NULL : (table->SortSpecsCount == 1) ? &table->SortSpecsSingle : table->SortSpecsMulti.Data;
    if (dirty && sort_specs != NULL)
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            if (column->SortOrder == -1)
                continue;
            IM_ASSERT(column->SortOrder < table->SortSpecsCount);
            ImGuiTableColumnSortSpecs* sort_spec = &sort_specs[column->SortOrder];
            sort_spec->ColumnUserID = column->UserID;
            sort_spec->ColumnIndex = (ImGuiTableColumnIdx)column_n;
            sort_spec->SortOrder = (ImGuiTableColumnIdx)column->SortOrder;
            sort_spec->SortDirection = column->SortDirection;
        }

    table->SortSpecs.Specs = sort_specs;
    table->SortSpecs.SpecsCount = table->SortSpecsCount;
}